

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void AddVarsToScope(ParseNode *vars,ByteCodeGenerator *byteCodeGenerator)

{
  SymbolType SVar1;
  bool bVar2;
  uint32 keyLength;
  ParseNodeVar *pPVar3;
  LPCOLESTR pOVar4;
  Symbol *this;
  char16 *pcVar5;
  FuncInfo *pFVar6;
  FunctionBody *this_00;
  FuncInfo *funcInfo_1;
  FuncInfo *funcInfo;
  Symbol *sym;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *vars_local;
  
  byteCodeGenerator_local = (ByteCodeGenerator *)vars;
  while (byteCodeGenerator_local != (ByteCodeGenerator *)0x0) {
    pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
    pOVar4 = Ident::Psz(pPVar3->pid);
    pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
    keyLength = Ident::Cch(pPVar3->pid);
    this = ByteCodeGenerator::AddSymbolToFunctionScope
                     (byteCodeGenerator,pOVar4,keyLength,(ParseNode *)byteCodeGenerator_local,
                      STVariable);
    SVar1 = Symbol::GetSymbolType(this);
    if ((SVar1 == STVariable) && (bVar2 = ByteCodeGenerator::Trace(byteCodeGenerator), bVar2)) {
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
      pOVar4 = Ident::Psz(pPVar3->pid);
      pcVar5 = Symbol::GetSymbolTypeName(this);
      Output::Print(L"current context has declared var %s of type %s\n",pOVar4,pcVar5);
    }
    bVar2 = Symbol::IsArguments(this);
    if (((bVar2) || (bVar2 = Symbol::IsSpecialSymbol(this), bVar2)) ||
       (pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local),
       pPVar3->pnodeInit == (ParseNodePtr)0x0)) {
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
      pPVar3->sym = this;
      bVar2 = Symbol::IsArguments(this);
      if (bVar2) {
        pFVar6 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        FuncInfo::SetArgumentsSymbol(pFVar6,this);
      }
      else {
        bVar2 = Symbol::IsSpecialSymbol(this);
        if (bVar2) {
          pFVar6 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          bVar2 = Symbol::IsThis(this);
          if (bVar2) {
            FuncInfo::SetThisSymbol(pFVar6,this);
            this_00 = FuncInfo::GetParsedFunctionBody(pFVar6);
            Js::ParseableFunctionInfo::SetHasThis(&this_00->super_ParseableFunctionInfo,true);
          }
          else {
            bVar2 = Symbol::IsNewTarget(this);
            if (bVar2) {
              FuncInfo::SetNewTargetSymbol(pFVar6,this);
            }
            else {
              bVar2 = Symbol::IsImportMeta(this);
              if (bVar2) {
                FuncInfo::SetImportMetaSymbol(pFVar6,this);
              }
              else {
                bVar2 = Symbol::IsSuper(this);
                if (bVar2) {
                  FuncInfo::SetSuperSymbol(pFVar6,this);
                }
                else {
                  bVar2 = Symbol::IsSuperConstructor(this);
                  if (bVar2) {
                    FuncInfo::SetSuperConstructorSymbol(pFVar6,this);
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
      pPVar3->sym = (Symbol *)0x0;
    }
    pPVar3 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
    byteCodeGenerator_local = (ByteCodeGenerator *)pPVar3->pnodeNext;
  }
  return;
}

Assistant:

void AddVarsToScope(ParseNode *vars, ByteCodeGenerator *byteCodeGenerator)
{
    while (vars != nullptr)
    {
        Symbol *sym = byteCodeGenerator->AddSymbolToFunctionScope(reinterpret_cast<const char16*>(vars->AsParseNodeVar()->pid->Psz()), vars->AsParseNodeVar()->pid->Cch(), vars, STVariable);

#if DBG_DUMP
        if (sym->GetSymbolType() == STVariable && byteCodeGenerator->Trace())
        {
            Output::Print(_u("current context has declared var %s of type %s\n"),
                vars->AsParseNodeVar()->pid->Psz(), sym->GetSymbolTypeName());
        }
#endif

        if (sym->IsArguments() || sym->IsSpecialSymbol() || vars->AsParseNodeVar()->pnodeInit == nullptr)
        {
            // LHS's of var decls are usually bound to symbols later, during the Visit/Bind pass,
            // so that things like catch scopes can be taken into account.
            // The exception is "arguments", which always binds to the local scope.
            // We can also bind to the function scope symbol now if there's no init value
            // to assign.
            vars->AsParseNodeVar()->sym = sym;
            if (sym->IsArguments())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetArgumentsSymbol(sym);
            }
            else if (sym->IsSpecialSymbol())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();

                if (sym->IsThis())
                {
                    funcInfo->SetThisSymbol(sym);
                    funcInfo->GetParsedFunctionBody()->SetHasThis(true);
                }
                else if (sym->IsNewTarget())
                {
                    funcInfo->SetNewTargetSymbol(sym);
                }
                else if (sym->IsImportMeta())
                {
                    funcInfo->SetImportMetaSymbol(sym);
                }
                else if (sym->IsSuper())
                {
                    funcInfo->SetSuperSymbol(sym);
                }
                else if (sym->IsSuperConstructor())
                {
                    funcInfo->SetSuperConstructorSymbol(sym);
                }
            }
        }
        else
        {
            vars->AsParseNodeVar()->sym = nullptr;
        }
        vars = vars->AsParseNodeVar()->pnodeNext;
    }
}